

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O1

bool __thiscall
SBPL2DGridSearch::search_exp
          (SBPL2DGridSearch *this,uchar **Grid2D,uchar obsthresh,int startx_c,int starty_c,
          int goalx_c,int goaly_c)

{
  SBPL_2DGridSearchState *pSVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  runtime_error *this_00;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  AbstractSearchState *__filename;
  uint uVar13;
  long lVar14;
  CList OPEN2DLIST;
  CList local_58;
  long local_38;
  
  local_58.firstelement = (listelement *)0x0;
  local_58.lastelement = (listelement *)0x0;
  local_58.currentsize = 0;
  clock();
  iVar6 = this->iteration_ + 1;
  this->iteration_ = iVar6;
  this->startX_ = startx_c;
  this->startY_ = starty_c;
  this->goalX_ = goalx_c;
  this->goalY_ = goaly_c;
  if (((((-1 < (starty_c | startx_c)) && (startx_c < this->width_)) && (starty_c < this->height_))
      && ((-1 < (goaly_c | goalx_c) && (goalx_c < this->width_)))) && (goaly_c < this->height_)) {
    pSVar1 = this->searchStates2D_[startx_c] + starty_c;
    (pSVar1->super_AbstractSearchState).heapindex = 0;
    pSVar1->iterationaccessed = iVar6;
    pSVar1->g = 0;
    (pSVar1->super_AbstractSearchState).listelem[0] = (listelement *)0x0;
    CList::insert(&local_58,&pSVar1->super_AbstractSearchState,0);
    if (local_58.currentsize != 0) {
      do {
        if (local_58.lastelement == (listelement *)0x0) {
          __filename = (AbstractSearchState *)0x0;
        }
        else {
          __filename = (local_58.lastelement)->liststate;
        }
        CList::remove(&local_58,(char *)__filename);
        uVar2 = *(uint *)__filename[1].listelem;
        uVar3 = *(uint *)((long)__filename[1].listelem + 4);
        uVar12 = 0;
        do {
          lVar9 = (long)this->dx_[uVar12] + (long)(int)uVar2;
          lVar14 = (long)this->dy_[uVar12] + (long)(int)uVar3;
          uVar13 = (uint)lVar14;
          uVar8 = (uint)lVar9;
          if (((-1 < (int)(uVar13 | uVar8)) && ((int)uVar8 < this->width_)) &&
             ((int)uVar13 < this->height_)) {
            bVar4 = (*this->getCost)(Grid2D,uVar8,uVar13,this->downsample_);
            bVar5 = (*this->getCost)(Grid2D,uVar2,uVar3,this->downsample_);
            uVar11 = uVar2;
            uVar7 = uVar3;
            if (bVar5 < bVar4) {
              uVar11 = uVar8;
              uVar7 = uVar13;
            }
            local_38 = lVar9;
            bVar4 = (*this->getCost)(Grid2D,uVar11,uVar7,this->downsample_);
            uVar8 = (uint)bVar4;
            if (7 < uVar12) {
              bVar5 = (*this->getCost)(Grid2D,this->dx0intersects_[uVar12] + uVar2,
                                       this->dy0intersects_[uVar12] + uVar3,this->downsample_);
              if (bVar4 <= bVar5) {
                bVar4 = (*this->getCost)(Grid2D,this->dx0intersects_[uVar12] + uVar2,
                                         this->dy0intersects_[uVar12] + uVar3,this->downsample_);
                uVar8 = (uint)bVar4;
              }
              bVar4 = (*this->getCost)(Grid2D,this->dx1intersects_[uVar12] + uVar2,
                                       this->dy1intersects_[uVar12] + uVar3,this->downsample_);
              if (uVar8 <= bVar4) {
                bVar4 = (*this->getCost)(Grid2D,this->dx1intersects_[uVar12] + uVar2,
                                         this->dy1intersects_[uVar12] + uVar3,this->downsample_);
                uVar8 = (uint)bVar4;
              }
            }
            if (uVar8 < obsthresh) {
              iVar10 = (uVar8 + 1) * this->dxy_distance_mm_[uVar12];
              pSVar1 = this->searchStates2D_[local_38] + lVar14;
              iVar6 = this->iteration_;
              if (pSVar1->iterationaccessed == iVar6) {
                if (pSVar1->g <= *(int *)(__filename[1].listelem + 1) + iVar10) goto LAB_00145307;
              }
              else {
                (pSVar1->super_AbstractSearchState).listelem[0] = (listelement *)0x0;
              }
              pSVar1->iterationaccessed = iVar6;
              iVar10 = iVar10 + *(int *)(__filename[1].listelem + 1);
              iVar6 = iVar10;
              if (999999999 < iVar10) {
                iVar6 = 1000000000;
              }
              pSVar1->g = iVar6;
              if (999999999 < iVar10) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"ERROR: infinite g");
                *(undefined ***)this_00 = &PTR__runtime_error_001574d0;
                __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
              }
              if ((pSVar1->super_AbstractSearchState).listelem[0] == (listelement *)0x0) {
                CList::insert(&local_58,&pSVar1->super_AbstractSearchState,0);
              }
            }
          }
LAB_00145307:
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0x10);
      } while (local_58.currentsize != 0);
    }
    this->largestcomputedoptf_ = 1000000000;
  }
  return false;
}

Assistant:

bool SBPL2DGridSearch::search_exp(unsigned char** Grid2D, unsigned char obsthresh, int startx_c, int starty_c,
                                  int goalx_c, int goaly_c)
{
    SBPL_2DGridSearchState *searchExpState = NULL;
    SBPL_2DGridSearchState *searchPredState = NULL;
    int numofExpands = 0;
    CList OPEN2DLIST;

    //get the current time
    clock_t starttime = clock();

    //closed = 0
    iteration_++;

    //init start and goal coordinates
    startX_ = startx_c;
    startY_ = starty_c;
    goalX_ = goalx_c;
    goalY_ = goaly_c;

    //check the validity of start/goal
    if (!withinMap(startx_c, starty_c) || !withinMap(goalx_c, goaly_c)) {
        SBPL_ERROR("ERROR: grid2Dsearch is called on invalid start (%d %d) or goal(%d %d)\n", startx_c, starty_c,
                   goalx_c, goaly_c);
        return false;
    }

    // initialize the start and goal states
    searchExpState = &searchStates2D_[startX_][startY_];
    initializeSearchState2D(searchExpState);
    //no initialization for the goal state - it will reset iteration_ variable

    //seed the search
    searchExpState->g = 0;
    searchExpState->listelem[SBPL_2DSEARCH_OPEN_LIST_ID] = NULL;
    OPEN2DLIST.insertinfront(searchExpState, SBPL_2DSEARCH_OPEN_LIST_ID);

    //the main repetition of expansions
    while (!OPEN2DLIST.empty()) {
        //get the next state for expansion
        searchExpState = (SBPL_2DGridSearchState*)OPEN2DLIST.getlast();
        OPEN2DLIST.remove(searchExpState, SBPL_2DSEARCH_OPEN_LIST_ID);
        numofExpands++;

        int exp_x = searchExpState->x;
        int exp_y = searchExpState->y;

        //iterate over successors
        for (int dir = 0; dir < SBPL_2DGRIDSEARCH_NUMOF2DDIRS; dir++) {
            int newx = exp_x + dx_[dir];
            int newy = exp_y + dy_[dir];

            //make sure it is inside the map and has no obstacle
            if (!withinMap(newx, newy)) continue;

            //compute the cost
            int mapcost = __max( getCost(Grid2D, newx, newy, downsample_), getCost(Grid2D, exp_x, exp_y, downsample_));

#if SBPL_2DGRIDSEARCH_NUMOF2DDIRS > 8
            if(dir > 7) {
                //check two more cells through which the action goes
                mapcost = __max(mapcost, getCost(Grid2D, exp_x + dx0intersects_[dir], exp_y + dy0intersects_[dir], downsample_));
                mapcost = __max(mapcost, getCost(Grid2D, exp_x + dx1intersects_[dir], exp_y + dy1intersects_[dir], downsample_));
            }
#endif

            if (mapcost >= obsthresh) //obstacle encountered
            continue;
            int cost = (mapcost + 1) * dxy_distance_mm_[dir];

            //get the predecessor
            searchPredState = &searchStates2D_[newx][newy];

            //clear the list
            if (searchPredState->iterationaccessed != iteration_) searchPredState->listelem[SBPL_2DSEARCH_OPEN_LIST_ID]
                = NULL;

            //update predecessor if necessary
            if (searchPredState->iterationaccessed != iteration_ || searchPredState->g > cost + searchExpState->g) {
                searchPredState->iterationaccessed = iteration_;
                searchPredState->g = __min(INFINITECOST, cost + searchExpState->g);

                if (searchPredState->g >= INFINITECOST) {
                    throw SBPL_Exception("ERROR: infinite g");
                }

                //put it into the list if not there already
                if (searchPredState->listelem[SBPL_2DSEARCH_OPEN_LIST_ID] == NULL)
                    OPEN2DLIST.insertinfront(searchPredState, SBPL_2DSEARCH_OPEN_LIST_ID);
                //otherwise, the state remains where it is but it now has a new g-value
            }
        } //over successors
    }//while

    //set lower bounds for the remaining states - none left since we exhausted the whole list
    largestcomputedoptf_ = INFINITECOST;

    SBPL_PRINTF( "# of expands during 2dgridsearch=%d time=%d msecs 2Dsolcost_inmm=%d "
                "largestoptfval=%d (start=%d %d goal=%d %d)\n",
                numofExpands, (int)(((clock() - starttime) / (double)CLOCKS_PER_SEC) * 1000),
                searchStates2D_[goalx_c][goaly_c].g, largestcomputedoptf_, startx_c, starty_c, goalx_c, goaly_c);

    return false;
}